

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

void __thiscall H264StreamReader::updateHRDParam(H264StreamReader *this,SPSUnit *sps)

{
  if (this->m_needSeiCorrection == true) {
    if (sps->vui_parameters_present_flag == 0) {
      SPSUnit::setFps(sps,(this->super_MPEGStreamReader).m_fps);
    }
    SPSUnit::insertHrdParameters(sps);
    return;
  }
  return;
}

Assistant:

void H264StreamReader::updateHRDParam(SPSUnit *sps) const
{
    // correct HRD parameters here (this function is called for every SPS nal unit)
    if (!m_needSeiCorrection)
        return;

    // if (!orig_hrd_parameters_present_flag && !orig_vcl_parameters_present_flag)
    //{
    //}
    if (!sps->vui_parameters_present_flag)
        sps->setFps(m_fps);
    sps->insertHrdParameters();
}